

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O2

char * cmd_name(skynet_context *context,char *param)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char acStack_40 [16];
  
  acStack_40[0] = -0x74;
  acStack_40[1] = ':';
  acStack_40[2] = '\x11';
  acStack_40[3] = '\0';
  acStack_40[4] = '\0';
  acStack_40[5] = '\0';
  acStack_40[6] = '\0';
  acStack_40[7] = '\0';
  sVar4 = strlen(param);
  uVar5 = (ulong)((int)sVar4 + 1) + 0xf & 0xfffffffffffffff0;
  lVar2 = -uVar5;
  pcVar8 = acStack_40 + lVar2 + 8;
  lVar3 = -uVar5;
  pcVar7 = pcVar8 + lVar3;
  pcVar6 = (char *)0x0;
  pcVar7[-8] = -0x3e;
  pcVar7[-7] = ':';
  pcVar7[-6] = '\x11';
  pcVar7[-5] = '\0';
  pcVar7[-4] = '\0';
  pcVar7[-3] = '\0';
  pcVar7[-2] = '\0';
  pcVar7[-1] = '\0';
  __isoc99_sscanf(param,"%s %s",pcVar8,pcVar7);
  if (*pcVar7 == ':') {
    pcVar6 = (char *)0x0;
    pcVar7[-8] = '\x10';
    pcVar7[-7] = '\0';
    pcVar7[-6] = '\0';
    pcVar7[-5] = '\0';
    pcVar7[-4] = '\0';
    pcVar7[-3] = '\0';
    pcVar7[-2] = '\0';
    pcVar7[-1] = '\0';
    uVar1 = *(undefined8 *)(pcVar7 + -8);
    pcVar7[-8] = -0x24;
    pcVar7[-7] = ':';
    pcVar7[-6] = '\x11';
    pcVar7[-5] = '\0';
    pcVar7[-4] = '\0';
    pcVar7[-3] = '\0';
    pcVar7[-2] = '\0';
    pcVar7[-1] = '\0';
    uVar5 = strtoul(pcVar7 + 1,(char **)0x0,(int)uVar1);
    if ((uint32_t)uVar5 != 0) {
      if (*pcVar8 == '.') {
        pcVar7[-8] = -0xd;
        pcVar7[-7] = ':';
        pcVar7[-6] = '\x11';
        pcVar7[-5] = '\0';
        pcVar7[-4] = '\0';
        pcVar7[-3] = '\0';
        pcVar7[-2] = '\0';
        pcVar7[-1] = '\0';
        pcVar6 = skynet_handle_namehandle((uint32_t)uVar5,acStack_40 + lVar2 + 9);
      }
      else {
        pcVar6 = (char *)0x0;
        builtin_strncpy(acStack_40 + lVar3 + lVar2,"\x0f;\x11",4);
        pcVar7[-4] = '\0';
        pcVar7[-3] = '\0';
        pcVar7[-2] = '\0';
        pcVar7[-1] = '\0';
        skynet_error(context,"Can\'t set global name %s in C",pcVar8);
      }
    }
  }
  return pcVar6;
}

Assistant:

static const char *
cmd_name(struct skynet_context * context, const char * param) {
	int size = strlen(param);
	char name[size+1];
	char handle[size+1];
	sscanf(param,"%s %s",name,handle);
	if (handle[0] != ':') {
		return NULL;
	}
	uint32_t handle_id = strtoul(handle+1, NULL, 16);
	if (handle_id == 0) {
		return NULL;
	}
	if (name[0] == '.') {
		return skynet_handle_namehandle(handle_id, name + 1);
	} else {
		skynet_error(context, "Can't set global name %s in C", name);
	}
	return NULL;
}